

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicProfileInfo.cpp
# Opt level: O0

void __thiscall Js::DynamicProfileInfo::DynamicProfileInfo(DynamicProfileInfo *this)

{
  DynamicProfileInfo *this_local;
  
  Memory::WriteBarrierPtr<Js::DynamicProfileFunctionInfo>::WriteBarrierPtr
            (&this->dynamicProfileFunctionInfo);
  Memory::WriteBarrierPtr<Js::CallSiteInfo>::WriteBarrierPtr(&this->callSiteInfo);
  Memory::WriteBarrierPtr<Js::CallSiteInfo>::WriteBarrierPtr(&this->callApplyTargetInfo);
  Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr(&this->returnTypeInfo);
  Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr(&this->divideTypeInfo);
  Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr(&this->switchTypeInfo);
  Memory::WriteBarrierPtr<Js::LdLenInfo>::WriteBarrierPtr(&this->ldLenInfo);
  Memory::WriteBarrierPtr<Js::LdElemInfo>::WriteBarrierPtr(&this->ldElemInfo);
  Memory::WriteBarrierPtr<Js::StElemInfo>::WriteBarrierPtr(&this->stElemInfo);
  Memory::WriteBarrierPtr<Js::ArrayCallSiteInfo>::WriteBarrierPtr(&this->arrayCallSiteInfo);
  Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr(&this->parameterInfo);
  Memory::WriteBarrierPtr<Js::FldInfo>::WriteBarrierPtr(&this->fldInfo);
  Memory::WriteBarrierPtr<ValueType>::WriteBarrierPtr(&this->slotInfo);
  Memory::WriteBarrierPtr<Js::ImplicitCallFlags>::WriteBarrierPtr(&this->loopImplicitCallFlags);
  Memory::WriteBarrierPtr<BVFixed>::WriteBarrierPtr(&this->loopFlags);
  ThisInfo::ThisInfo(&this->thisInfo);
  Memory::WriteBarrierPtr<Js::FunctionBody>::WriteBarrierPtr(&this->functionBody);
  this->hasFunctionBody = false;
  return;
}

Assistant:

DynamicProfileInfo::DynamicProfileInfo()
    {
        hasFunctionBody = false;
    }